

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_response.hpp
# Opt level: O0

void __thiscall
cinatra::coro_http_response::coro_http_response(coro_http_response *this,coro_http_connection *conn)

{
  undefined8 in_RSI;
  undefined4 *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  
  *in_RDI = 0x1f5;
  in_RDI[1] = 0;
  std::__cxx11::string::string(unaff_retaddr);
  std::optional<bool>::optional((optional<bool> *)0x394b8a);
  *(undefined1 *)((long)in_RDI + 0x2a) = 0;
  std::vector<cinatra::resp_header,_std::allocator<cinatra::resp_header>_>::vector
            ((vector<cinatra::resp_header,_std::allocator<cinatra::resp_header>_> *)0x394b9b);
  std::span<cinatra::http_header,_18446744073709551615UL>::span
            ((span<cinatra::http_header,_18446744073709551615UL> *)0x394ba8);
  *(undefined8 *)(in_RDI + 0x1e) = in_RSI;
  std::__cxx11::string::string(unaff_retaddr);
  *(undefined1 *)(in_RDI + 0x28) = 0;
  *(undefined1 *)((long)in_RDI + 0xa1) = 0;
  *(undefined1 *)((long)in_RDI + 0xa2) = 1;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cinatra::cookie,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cinatra::cookie>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cinatra::cookie,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cinatra::cookie>_>_>
                   *)0x394be6);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 0x38));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 0x3c));
  return;
}

Assistant:

coro_http_response(coro_http_connection *conn)
      : status_(status_type::not_implemented),
        fmt_type_(format_type::normal),
        delay_(false),
        conn_(conn) {}